

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O2

void __thiscall HighsLogOptions::clear(HighsLogOptions *this)

{
  this->user_log_callback = (_func_void_HighsLogType_char_ptr_void_ptr *)0x0;
  this->user_log_callback_data = (void *)0x0;
  this->log_to_console = (bool *)0x0;
  this->log_dev_level = (HighsInt *)0x0;
  this->log_stream = (FILE *)0x0;
  this->output_flag = (bool *)0x0;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(&this->user_callback,(nullptr_t)0x0);
  this->user_callback_data = (void *)0x0;
  this->user_callback_active = false;
  return;
}

Assistant:

void HighsLogOptions::clear() {
  this->log_stream = nullptr;
  this->output_flag = nullptr;
  this->log_to_console = nullptr;
  this->log_dev_level = nullptr;
  this->user_log_callback = nullptr;
  this->user_log_callback_data = nullptr;
  this->user_callback = nullptr;
  this->user_callback_data = nullptr;
  this->user_callback_active = false;
}